

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

int32_t internal_exr_compute_chunk_offset_size(exr_priv_part_t curpart)

{
  int y_sampling;
  undefined8 uVar1;
  undefined8 uVar2;
  int *piVar3;
  uint *puVar4;
  undefined2 uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  long in_RDI;
  uint64_t cunpsz_1;
  int ysamp;
  int xsamp;
  int c_1;
  int h;
  int linePerChunk;
  uint64_t cunpsz;
  int c;
  int32_t ly;
  int32_t lx;
  int32_t l;
  int64_t tilecount;
  exr_attr_tiledesc_t *tiledesc;
  int hasLineSample;
  uint64_t w;
  uint64_t unpackedsize;
  exr_attr_chlist_t *channels;
  exr_attr_box2i_t dw;
  int32_t retval;
  long local_90;
  int local_7c;
  long local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  long local_58;
  long local_38;
  int local_24;
  int iStack_20;
  int local_1c;
  int iStack_18;
  int local_14;
  int local_4;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x90);
  uVar2 = *(undefined8 *)(in_RDI + 0x98);
  piVar3 = *(int **)(*(long *)(in_RDI + 0x20) + 0x18);
  local_38 = 0;
  uVar5 = 0;
  if (*(int *)(in_RDI + 4) == 5) {
    if (*(int *)(in_RDI + 0xf4) < 1) {
      local_4 = 0;
    }
    else {
      local_4 = *(int *)(in_RDI + 0xf4);
    }
  }
  else {
    local_1c = (int)uVar2;
    local_24 = (int)uVar1;
    if (*(long *)(in_RDI + 0x60) == 0) {
      local_14 = exr_compression_lines_per_chunk(*(exr_compression_t *)(in_RDI + 0xb0));
      *(short *)(in_RDI + 0xf0) = (short)local_14;
      if (local_14 < 0) {
        return -1;
      }
      for (local_7c = 0; iStack_20 = (int)((ulong)uVar1 >> 0x20), local_7c < *piVar3;
          local_7c = local_7c + 1) {
        y_sampling = *(int *)(*(long *)(piVar3 + 2) + (long)local_7c * 0x20 + 0x1c);
        if (*(int *)(*(long *)(piVar3 + 2) + (long)local_7c * 0x20 + 0x10) == 1) {
          local_90 = 2;
        }
        else {
          local_90 = 4;
        }
        iVar7 = compute_sampled_width
                          ((local_1c - local_24) + 1,
                           *(int *)(*(long *)(piVar3 + 2) + (long)local_7c * 0x20 + 0x18),local_24);
        iVar8 = compute_sampled_height(local_14,y_sampling,iStack_20);
        if (1 < y_sampling) {
          uVar5 = 1;
        }
        local_38 = (long)iVar8 * iVar7 * local_90 + local_38;
      }
      *(long *)(in_RDI + 0xe8) = local_38;
      *(undefined2 *)(in_RDI + 0xf2) = uVar5;
      iStack_18 = (int)((ulong)uVar2 >> 0x20);
      local_14 = ((iStack_18 - iStack_20) + local_14) / local_14;
    }
    else {
      puVar4 = *(uint **)(*(long *)(in_RDI + 0x60) + 0x18);
      local_58 = 0;
      bVar6 = (byte)puVar4[2] & 0xf;
      if (bVar6 < 2) {
        for (local_5c = 0; local_5c < *(int *)(in_RDI + 0xc0); local_5c = local_5c + 1) {
          local_58 = (long)*(int *)(*(long *)(in_RDI + 200) + (long)local_5c * 4) *
                     (long)*(int *)(*(long *)(in_RDI + 0xd0) + (long)local_5c * 4) + local_58;
        }
        if (0x7fffffff < local_58) {
          return -1;
        }
        local_14 = (int)local_58;
      }
      else {
        if (bVar6 != 2) {
          return -1;
        }
        for (local_60 = 0; local_60 < *(int *)(in_RDI + 0xc0); local_60 = local_60 + 1) {
          for (local_64 = 0; local_64 < *(int *)(in_RDI + 0xc4); local_64 = local_64 + 1) {
            local_58 = (long)*(int *)(*(long *)(in_RDI + 200) + (long)local_60 * 4) *
                       (long)*(int *)(*(long *)(in_RDI + 0xd0) + (long)local_64 * 4) + local_58;
            if (0x7fffffff < local_58) {
              return -1;
            }
          }
        }
        local_14 = (int)local_58;
      }
      for (local_68 = 0; local_68 < *piVar3; local_68 = local_68 + 1) {
        if (*(int *)(*(long *)(piVar3 + 2) + (long)local_68 * 0x20 + 0x10) == 1) {
          local_70 = 2;
        }
        else {
          local_70 = 4;
        }
        local_38 = (ulong)puVar4[1] * (ulong)*puVar4 * local_70 + local_38;
      }
      *(long *)(in_RDI + 0xe8) = local_38;
      *(undefined2 *)(in_RDI + 0xf2) = 0;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (exr_priv_part_t curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    if (curpart->storage_mode == EXR_STORAGE_UNKNOWN)
    {
        if (curpart->chunk_count > 0)
            return curpart->chunk_count;
        return 0;
    }

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            /* tiles do not allow x/y sub sampling */
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) tiledesc->x_size;
            cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        int linePerChunk, h;

        linePerChunk = exr_compression_lines_per_chunk (curpart->comp_type);

        curpart->lines_per_chunk = linePerChunk;

        if (linePerChunk < 0) return -1;

        for (int c = 0; c < channels->num_channels; ++c)
        {
            int xsamp  = channels->entries[c].x_sampling;
            int ysamp  = channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) compute_sampled_width (w, xsamp, dw.min.x);
            cunpsz *= (uint64_t) compute_sampled_height (linePerChunk, ysamp, dw.min.y);
            if (ysamp > 1)
                hasLineSample = 1;
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}